

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O1

void * __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,size_t size)

{
  ChunkHeader *pCVar1;
  size_t sVar2;
  bool bVar3;
  ulong uVar4;
  ulong capacity;
  
  if (size == 0) {
    return (void *)0x0;
  }
  uVar4 = size + 7 & 0xfffffffffffffff8;
  pCVar1 = this->chunkHead_;
  if ((pCVar1 == (ChunkHeader *)0x0) || (pCVar1->capacity < pCVar1->size + uVar4)) {
    capacity = this->chunk_capacity_;
    if (this->chunk_capacity_ <= uVar4) {
      capacity = uVar4;
    }
    bVar3 = AddChunk(this,capacity);
    if (!bVar3) {
      return (void *)0x0;
    }
  }
  pCVar1 = this->chunkHead_;
  sVar2 = pCVar1->size;
  pCVar1->size = uVar4 + sVar2;
  return (void *)((long)&pCVar1[1].capacity + sVar2);
}

Assistant:

void* Malloc(size_t size) {
        if (!size)
            return NULL;

        size = RAPIDJSON_ALIGN(size);
        if (chunkHead_ == 0 || chunkHead_->size + size > chunkHead_->capacity)
            if (!AddChunk(chunk_capacity_ > size ? chunk_capacity_ : size))
                return NULL;

        void *buffer = reinterpret_cast<char *>(chunkHead_) + RAPIDJSON_ALIGN(sizeof(ChunkHeader)) + chunkHead_->size;
        chunkHead_->size += size;
        return buffer;
    }